

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcChain.c
# Opt level: O3

Abc_Cex_t *
Bmc_ChainFailOneOutput(Gia_Man_t *p,int nFrameMax,int nConfMax,int fVerbose,int fVeryVerbose)

{
  int iVar1;
  Aig_Man_t *pAig;
  Aig_Man_t *pAVar2;
  Abc_Cex_t *pAVar3;
  Saig_ParBmc_t Pars;
  Saig_ParBmc_t SStack_c8;
  
  pAig = Gia_ManToAigSimple(p);
  Saig_ParBmcSetDefaultParams(&SStack_c8);
  pAVar2 = pAig;
  SStack_c8.nFramesMax = nFrameMax;
  SStack_c8.nConfLimit = nConfMax;
  SStack_c8.fVerbose = fVeryVerbose;
  iVar1 = Saig_ManBmcScalable(pAig,&SStack_c8);
  if (iVar1 == 0) {
    pAVar3 = pAig->pSeqModel;
    pAig->pSeqModel = (Abc_Cex_t *)0x0;
    if (fVeryVerbose != 0) {
      Abc_Print((int)pAVar2,"Output %d of miter \"%s\" was asserted in frame %d.\n",
                (ulong)(uint)pAVar3->iPo,p->pName,(ulong)(uint)pAVar3->iFrame);
    }
  }
  else if (fVeryVerbose == 0) {
    pAVar3 = (Abc_Cex_t *)0x0;
  }
  else {
    pAVar3 = (Abc_Cex_t *)0x0;
    Abc_Print((int)pAVar2,"No output asserted in %d frames. Resource limit reached.\n",
              (ulong)(SStack_c8.iFrame + 2));
  }
  Aig_ManStop(pAig);
  return pAVar3;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Find the first failure.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Abc_Cex_t * Bmc_ChainFailOneOutput( Gia_Man_t * p, int nFrameMax, int nConfMax, int fVerbose, int fVeryVerbose )
{
    int RetValue;
    Abc_Cex_t * pCex = NULL;
    Aig_Man_t * pAig = Gia_ManToAigSimple( p );
    Saig_ParBmc_t Pars, * pPars = &Pars;
    Saig_ParBmcSetDefaultParams( pPars );
    pPars->nFramesMax = nFrameMax;
    pPars->nConfLimit = nConfMax;
    pPars->fVerbose   = fVeryVerbose;
    RetValue = Saig_ManBmcScalable( pAig, pPars );
    if ( RetValue == 0 ) // SAT
    {
        pCex = pAig->pSeqModel, pAig->pSeqModel = NULL;
        if ( fVeryVerbose )
            Abc_Print( 1, "Output %d of miter \"%s\" was asserted in frame %d.\n", pCex->iPo, p->pName, pCex->iFrame );
    }
    else if ( fVeryVerbose )
        Abc_Print( 1, "No output asserted in %d frames. Resource limit reached.\n", pPars->iFrame+2 );
    Aig_ManStop( pAig );
    return pCex;
}